

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O3

LY_ERR lyplg_init(ly_bool builtin_type_plugins_only)

{
  uint32_t uVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  bool bVar4;
  
  pthread_mutex_lock((pthread_mutex_t *)&plugins_guard);
  uVar1 = context_refcount + 1;
  bVar4 = context_refcount == 0;
  context_refcount = uVar1;
  if ((bVar4) &&
     ((((((((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_binary), LVar2 != LY_SUCCESS ||
            (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_bits), LVar2 != LY_SUCCESS)) ||
           (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_boolean), LVar2 != LY_SUCCESS))
          || (((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_decimal64),
               LVar2 != LY_SUCCESS ||
               (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_empty), LVar2 != LY_SUCCESS)
               ) || ((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_enumeration),
                     LVar2 != LY_SUCCESS ||
                     ((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_identityref),
                      LVar2 != LY_SUCCESS ||
                      (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_instanceid),
                      LVar2 != LY_SUCCESS)))))))) ||
         (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_integer), LVar2 != LY_SUCCESS)) ||
        ((((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_leafref), LVar2 != LY_SUCCESS ||
           (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_string), LVar2 != LY_SUCCESS))
          || (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_union), LVar2 != LY_SUCCESS))
         || ((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_metadata),
             LVar2 != LY_SUCCESS ||
             (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_lyds_tree),
             LVar2 != LY_SUCCESS)))))) ||
       ((builtin_type_plugins_only == '\0' &&
        ((((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_instanceid_keys),
           LVar2 != LY_SUCCESS ||
           (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv4_address),
           LVar2 != LY_SUCCESS)) ||
          (((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv4_address_no_zone),
            LVar2 != LY_SUCCESS ||
            (((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv6_address),
              LVar2 != LY_SUCCESS ||
              (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv6_address_no_zone),
              LVar2 != LY_SUCCESS)) ||
             (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv4_prefix),
             LVar2 != LY_SUCCESS)))) ||
           (((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_ipv6_prefix),
             LVar2 != LY_SUCCESS ||
             (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_date_and_time),
             LVar2 != LY_SUCCESS)) ||
            (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_hex_string),
            LVar2 != LY_SUCCESS)))))) ||
         (((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_xpath10), LVar2 != LY_SUCCESS ||
           (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_time_period),
           LVar2 != LY_SUCCESS)) ||
          (((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_TYPE,plugins_node_instanceid),
            LVar2 != LY_SUCCESS ||
            (((LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_nacm),
              LVar2 != LY_SUCCESS ||
              (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_yangdata),
              LVar2 != LY_SUCCESS)) ||
             (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_schema_mount),
             LVar2 != LY_SUCCESS)))) ||
           (LVar2 = plugins_insert((ly_ctx *)0x0,LYPLG_EXTENSION,plugins_structure),
           LVar2 != LY_SUCCESS)))))))))) ||
      ((LVar2 = plugins_insert_dir(LYPLG_TYPE), LVar2 != LY_SUCCESS ||
       (LVar2 = plugins_insert_dir(LYPLG_EXTENSION), LVar2 != LY_SUCCESS)))))) {
    lyplg_clean_();
    pthread_mutex_unlock((pthread_mutex_t *)&plugins_guard);
    LVar3 = LY_EINT;
    if (LVar2 != LY_EINVAL) {
      LVar3 = LVar2;
    }
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)&plugins_guard);
    LVar3 = LY_SUCCESS;
  }
  return LVar3;
}

Assistant:

LY_ERR
lyplg_init(ly_bool builtin_type_plugins_only)
{
    LY_ERR ret;

    pthread_mutex_lock(&plugins_guard);
    /* let only the first context to initiate plugins, but let others wait for finishing the initiation */
    if (context_refcount++) {
        /* already initiated */
        pthread_mutex_unlock(&plugins_guard);
        return LY_SUCCESS;
    }

    /* internal types */
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_binary), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_bits), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_boolean), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_decimal64), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_empty), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_enumeration), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_identityref), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_instanceid), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_integer), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_leafref), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_string), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_union), error);

    /* metadata and lyds_tree, which requires them */
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_metadata), error);
    LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_lyds_tree), error);

    if (!builtin_type_plugins_only) {
        /* yang */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_instanceid_keys), error);

        /* ietf-inet-types */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv4_address), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv4_address_no_zone), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv6_address), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv6_address_no_zone), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv4_prefix), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_ipv6_prefix), error);

        /* ietf-yang-types */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_date_and_time), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_hex_string), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_xpath10), error);

        /* libnetconf2-netconf-server */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_time_period), error);

        /* ietf-netconf-acm */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_TYPE, plugins_node_instanceid), error);

        /* internal extensions */
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_nacm), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_yangdata), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_schema_mount), error);
        LY_CHECK_GOTO(ret = plugins_insert(NULL, LYPLG_EXTENSION, plugins_structure), error);
    }

#ifndef STATIC
    /* external types */
    LY_CHECK_GOTO(ret = plugins_insert_dir(LYPLG_TYPE), error);

    /* external extensions */
    LY_CHECK_GOTO(ret = plugins_insert_dir(LYPLG_EXTENSION), error);
#endif

    /* initiation done, wake-up possibly waiting threads creating another contexts */
    pthread_mutex_unlock(&plugins_guard);

    return LY_SUCCESS;

error:
    /* initiation was not successful - cleanup (and let others to try) */
#ifndef STATIC
    lyplg_clean_();
#endif
    pthread_mutex_unlock(&plugins_guard);

    if (ret == LY_EINVAL) {
        /* all the plugins here are internal, invalid record actually means an internal libyang error */
        ret = LY_EINT;
    }
    return ret;
}